

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codafind.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  char *local_38;
  
  verbosity = 0;
  if (argc != 1) {
    pcVar1 = argv[1];
    iVar3 = strcmp(pcVar1,"-h");
    if ((iVar3 != 0) && (iVar3 = strcmp(pcVar1,"--help"), iVar3 != 0)) {
      iVar3 = strcmp(pcVar1,"-v");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar1,"--version"), iVar3 == 0)) {
        print_version();
        goto LAB_00101613;
      }
      if ((argc < 3) || (iVar3 = strcmp(pcVar1,"-D"), iVar3 != 0)) {
        iVar3 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
        iVar5 = 1;
        if (iVar3 != 0) goto LAB_00101629;
      }
      else {
        coda_set_definition_path(argv[2]);
        iVar5 = 3;
      }
      uVar4 = 1;
      if (iVar5 < argc) {
        local_38 = (char *)0x0;
        uVar4 = 1;
        do {
          pcVar1 = argv[iVar5];
          iVar3 = strcmp(pcVar1,"-d");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar1,"--disable_conversions"), iVar3 == 0)) {
            uVar4 = 0;
            iVar3 = iVar5;
            pcVar2 = local_38;
          }
          else {
            iVar3 = strcmp(pcVar1,"-f");
            if ((((iVar3 != 0) && (iVar3 = strcmp(pcVar1,"--filter"), iVar3 != 0)) ||
                (iVar3 = iVar5 + 1, argc <= iVar3)) || (pcVar2 = argv[iVar3], *argv[iVar3] == '-'))
            {
              iVar3 = strcmp(pcVar1,"-V");
              if ((iVar3 != 0) && (iVar3 = strcmp(pcVar1,"--verbosity"), iVar3 != 0)) {
                if (*pcVar1 == '-') {
                  main_cold_2();
                  goto LAB_00101607;
                }
                break;
              }
              verbosity = 1;
              iVar3 = iVar5;
              pcVar2 = local_38;
            }
          }
          local_38 = pcVar2;
          iVar5 = iVar3 + 1;
        } while (iVar5 < argc);
      }
      else {
        local_38 = (char *)0x0;
      }
      if (argc - iVar5 == 0) {
        main_cold_5();
LAB_0010161f:
        main_cold_3();
      }
      else {
        iVar3 = coda_init();
        if (iVar3 != 0) goto LAB_0010161f;
        coda_set_option_perform_conversions(uVar4);
        iVar3 = coda_match_filefilter(local_38,argc - iVar5,argv + iVar5,callback,0);
        if (iVar3 == 0) {
          coda_done();
          return 0;
        }
      }
      main_cold_4();
LAB_00101629:
      main_cold_1();
      puts("Usage:");
      puts("    codafind [-D definitionpath] [<options>] <files|directories>");
      puts("        Match a filter on a series of files and/or recursively on all contents");
      puts("        of directories");
      putchar(10);
      puts("        Options:");
      puts("            -d, --disable_conversions");
      puts("                    do not perform unit/value conversions");
      puts("            -f, --filter \'<filter expression>\'");
      puts("                    restrict the output to data that matches the filter");
      puts("                    if no filter is provided codafind will find all files that");
      puts("                    can be opened with CODA");
      puts("            -V, --verbose");
      puts("                    show the match result for each file");
      putchar(10);
      puts("    codafind -h, --help");
      puts("        Show help (this text)");
      putchar(10);
      puts("    codafind -v, --version");
      puts("        Print the version number of CODA and exit");
      putchar(10);
      puts("    CODA will look for .codadef files using a definition path, which is a \':\'");
      puts("    separated (\';\' on Windows) list of paths to .codadef files and/or to");
      puts("    directories containing .codadef files.");
      puts("    By default the definition path is set to a single directory relative to");
      puts("    the tool location. A different definition path can be set via the");
      puts("    CODA_DEFINITION environment variable or via the -D option.");
      puts("    (the -D option overrides the environment variable setting).");
      iVar3 = putchar(10);
      return iVar3;
    }
  }
LAB_00101607:
  print_help();
LAB_00101613:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    char *filter = NULL;
    int perform_conversions;
    int i;

    verbosity = 0;
    perform_conversions = 1;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if ((strcmp(argv[i], "-f") == 0 || strcmp(argv[i], "--filter") == 0) &&
                 i + 1 < argc && argv[i + 1][0] != '-')
        {
            filter = argv[i + 1];
            i++;
        }
        else if (strcmp(argv[i], "-V") == 0 || strcmp(argv[i], "--verbosity") == 0)
        {
            verbosity = 1;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are files */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    if (i == argc)
    {
        /* no files or directories provided */
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    coda_set_option_perform_conversions(perform_conversions);

    if (coda_match_filefilter(filter, argc - i, (const char **)&argv[i], &callback, NULL) != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    coda_done();

    return 0;
}